

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_update_format(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  bcf_fmt_t *pbVar10;
  uint uVar11;
  ulong uVar12;
  bcf_fmt_t *pbVar13;
  size_t __n;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  kstring_t str;
  kstring_t local_58;
  bcf_fmt_t *local_40;
  int32_t *local_38;
  
  local_38 = (int32_t *)values;
  uVar7 = bcf_hdr_id2int(hdr,0,key);
  if (((int)uVar7 < 0) || ((~(hdr->id[0][uVar7].val)->info[2] & 0xf) == 0)) {
    return -(uint)(n != 0);
  }
  if ((line->unpacked & 8) == 0) {
    bcf_unpack(line,8);
  }
  uVar9 = *(ulong *)&line->field_0x10;
  if ((uVar9 & 0xff00000000) == 0) {
    uVar12 = 0;
LAB_00124013:
    if ((uint)uVar12 == ((uint)(uVar9 >> 0x20) & 0xff)) goto LAB_00124017;
    pbVar10 = (line->d).fmt;
    pbVar13 = pbVar10 + (uVar12 & 0xffffffff);
    local_40 = pbVar13;
    if (n == 0) {
      if (pbVar10 == (bcf_fmt_t *)0x0) {
        return 0;
      }
      if ((int)*(uint *)&pbVar13->field_0x1c < 0) {
        free(pbVar13->p + -(ulong)(*(uint *)&pbVar13->field_0x1c & 0x7fffffff));
        pbVar13->field_0x1f = pbVar13->field_0x1f & 0x7f;
      }
      (line->d).indiv_dirty = 1;
      pbVar13->p = (uint8_t *)0x0;
      return 0;
    }
  }
  else {
    pbVar10 = (line->d).fmt;
    uVar12 = 0;
    do {
      if (pbVar10->id == uVar7) goto LAB_00124013;
      uVar12 = uVar12 + 1;
      pbVar10 = pbVar10 + 1;
    } while ((uVar9 >> 0x20 & 0xff) != uVar12);
LAB_00124017:
    if (n == 0) {
      return 0;
    }
    local_40 = (bcf_fmt_t *)0x0;
  }
  uVar11 = hdr->n[2] & 0xffffff;
  *(ulong *)&line->field_0x10 = uVar9 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
  iVar8 = n / (int)uVar11;
  if ((iVar8 == 0) || (uVar11 * iVar8 != n)) {
    __assert_fail("nps && nps*line->n_sample==n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                  ,0xae5,
                  "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                 );
  }
  local_58.l = 0;
  local_58.m = 0;
  local_58.s = (char *)0x0;
  bcf_enc_int1(&local_58,uVar7);
  if (type == 3) {
    bcf_enc_size(&local_58,iVar8,7);
    iVar8 = iVar8 * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28);
LAB_00124124:
    __n = (size_t)iVar8;
    uVar9 = local_58.l + __n + 1;
    pbVar16 = (byte *)local_58.s;
    if (local_58.m <= uVar9) {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      local_58.m = (uVar9 >> 0x10 | uVar9) + 1;
      pbVar16 = (byte *)realloc(local_58.s,local_58.m);
      pbVar10 = local_40;
      if (pbVar16 == (byte *)0x0) goto LAB_001241bf;
    }
    local_58.s = (char *)pbVar16;
    pbVar10 = local_40;
    memcpy(local_58.s + local_58.l,local_38,__n);
    local_58.l = __n + local_58.l;
    local_58.s[local_58.l] = 0;
  }
  else {
    if (type == 2) {
      bcf_enc_size(&local_58,iVar8,5);
      iVar8 = iVar8 * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28) * 4;
      goto LAB_00124124;
    }
    if (type != 1) {
      bcf_update_format_cold_1();
      goto LAB_00124680;
    }
    bcf_enc_vint(&local_58,n,local_38,iVar8);
    pbVar10 = local_40;
  }
LAB_001241bf:
  if (pbVar10 == (bcf_fmt_t *)0x0) {
    uVar12 = *(ulong *)&line->field_0x10 + 0x100000000;
    uVar9 = *(ulong *)&line->field_0x10 & 0xffffff00ffffffff | uVar12 & 0xff00000000;
    *(ulong *)&line->field_0x10 = uVar9;
    uVar7 = (uint)(uVar12 >> 0x20) & 0xff;
    iVar8 = (line->d).m_fmt;
    if (iVar8 < (int)uVar7) {
      uVar7 = uVar7 - 1;
      uVar7 = (int)uVar7 >> 1 | uVar7;
      uVar7 = (int)uVar7 >> 2 | uVar7;
      uVar7 = (int)uVar7 >> 4 | uVar7;
      uVar7 = (int)uVar7 >> 8 | uVar7;
      uVar7 = (int)uVar7 >> 0x10 | uVar7;
      (line->d).m_fmt = uVar7 + 1;
      pbVar10 = (bcf_fmt_t *)realloc((line->d).fmt,(long)(int)uVar7 * 0x20 + 0x20);
      (line->d).fmt = pbVar10;
      memset(pbVar10 + iVar8,0,((long)(line->d).m_fmt - (long)iVar8) * 0x20);
      uVar9 = *(ulong *)&line->field_0x10;
    }
    uVar7 = (uint)(uVar9 >> 0x20);
    if (((((uVar9 & 0xfe00000000) == 0) || (*key != 'G')) || (key[1] != 'T')) || (key[2] != '\0')) {
      pbVar10 = (bcf_fmt_t *)((long)&(line->d).fmt[-1].id + (ulong)((uVar7 & 0xff) << 5));
    }
    else {
      uVar12 = uVar9 >> 0x20 & 0xff;
      uVar9 = uVar12 + 1;
      uVar12 = (ulong)(uint)((int)uVar12 << 5);
      do {
        pbVar10 = (line->d).fmt;
        puVar1 = (undefined8 *)((long)&pbVar10[-2].id + uVar12);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pbVar10[-2].p + uVar12);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pbVar10[-1].p + uVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        puVar1 = (undefined8 *)((long)&pbVar10[-1].id + uVar12);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        uVar9 = uVar9 - 1;
        uVar12 = uVar12 - 0x20;
      } while (2 < uVar9);
      uVar7 = (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20);
      pbVar10 = (line->d).fmt;
    }
    if ((*local_58.s & 0xfU) == 2) {
      pbVar16 = (byte *)(local_58.s + 3);
      iVar8 = (int)*(short *)(local_58.s + 1);
    }
    else if ((*local_58.s & 0xfU) == 1) {
      pbVar16 = (byte *)(local_58.s + 2);
      iVar8 = (int)local_58.s[1];
    }
    else {
      pbVar16 = (byte *)(local_58.s + 5);
      iVar8 = *(int *)(local_58.s + 1);
    }
    pbVar10->id = iVar8;
    bVar3 = *pbVar16;
    pbVar10->type = bVar3 & 0xf;
    if (*pbVar16 < 0xf0) {
      pbVar15 = pbVar16 + 1;
      uVar11 = (uint)(*pbVar16 >> 4);
    }
    else if ((pbVar16[1] & 0xf) == 2) {
      uVar11 = (uint)*(short *)(pbVar16 + 2);
      pbVar15 = pbVar16 + 4;
    }
    else if ((pbVar16[1] & 0xf) == 1) {
      uVar11 = (uint)(char)pbVar16[2];
      pbVar15 = pbVar16 + 3;
    }
    else {
      uVar11 = *(uint *)(pbVar16 + 2);
      pbVar15 = pbVar16 + 6;
    }
    pbVar10->n = uVar11;
    iVar8 = uVar11 << (bcf_type_shift[bVar3 & 0xf] & 0x1f);
    pbVar10->size = iVar8;
    pbVar10->p = pbVar15;
    *(uint *)&pbVar10->field_0x1c = (int)pbVar15 - (int)local_58.s & 0x7fffffff;
    pbVar10->p_len = iVar8 * (uVar7 >> 8);
    (line->d).indiv_dirty = 1;
    pbVar10->field_0x1f = pbVar10->field_0x1f | 0x80;
  }
  else {
    uVar7 = *(uint *)&pbVar10->field_0x1c & 0x7fffffff;
    uVar9 = (ulong)(pbVar10->p_len + uVar7);
    if (uVar9 < local_58.l) {
      if ((int)*(uint *)&pbVar10->field_0x1c < 0) {
LAB_00124680:
        __assert_fail("!fmt->p_free",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0xb1f,
                      "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                     );
      }
      uVar4 = *(undefined8 *)&line->field_0x10;
      if ((*local_58.s & 0xfU) == 2) {
        pbVar16 = (byte *)(local_58.s + 3);
        iVar8 = (int)*(short *)(local_58.s + 1);
      }
      else if ((*local_58.s & 0xfU) == 1) {
        pbVar16 = (byte *)(local_58.s + 2);
        iVar8 = (int)local_58.s[1];
      }
      else {
        pbVar16 = (byte *)(local_58.s + 5);
        iVar8 = *(int *)(local_58.s + 1);
      }
      pbVar10->id = iVar8;
      bVar3 = *pbVar16;
      pbVar10->type = bVar3 & 0xf;
      if (*pbVar16 < 0xf0) {
        pbVar15 = pbVar16 + 1;
        uVar7 = (uint)(*pbVar16 >> 4);
      }
      else if ((pbVar16[1] & 0xf) == 2) {
        uVar7 = (uint)*(short *)(pbVar16 + 2);
        pbVar15 = pbVar16 + 4;
      }
      else if ((pbVar16[1] & 0xf) == 1) {
        uVar7 = (uint)(char)pbVar16[2];
        pbVar15 = pbVar16 + 3;
      }
      else {
        uVar7 = *(uint *)(pbVar16 + 2);
        pbVar15 = pbVar16 + 6;
      }
      pbVar10->n = uVar7;
      iVar8 = uVar7 << (bcf_type_shift[bVar3 & 0xf] & 0x1f);
      pbVar10->size = iVar8;
      pbVar10->p = pbVar15;
      pbVar10->p_len = iVar8 * (uint)((ulong)uVar4 >> 0x28);
      *(uint *)&pbVar10->field_0x1c = (int)pbVar15 - (int)local_58.s | 0x80000000;
      (line->d).indiv_dirty = 1;
    }
    else {
      if (local_58.l != uVar9) {
        (line->d).indiv_dirty = 1;
        uVar7 = *(uint *)&pbVar10->field_0x1c & 0x7fffffff;
      }
      pbVar16 = pbVar10->p + -(ulong)uVar7;
      memcpy(pbVar16,local_58.s,local_58.l);
      free(local_58.s);
      uVar4 = *(undefined8 *)&line->field_0x10;
      if ((*pbVar16 & 0xf) == 2) {
        pbVar15 = pbVar16 + 3;
        iVar8 = (int)*(short *)(pbVar16 + 1);
      }
      else if ((*pbVar16 & 0xf) == 1) {
        pbVar15 = pbVar16 + 2;
        iVar8 = (int)(char)pbVar16[1];
      }
      else {
        pbVar15 = pbVar16 + 5;
        iVar8 = *(int *)(pbVar16 + 1);
      }
      pbVar10->id = iVar8;
      bVar3 = *pbVar15;
      pbVar10->type = bVar3 & 0xf;
      if (*pbVar15 < 0xf0) {
        pbVar14 = pbVar15 + 1;
        uVar7 = (uint)(*pbVar15 >> 4);
      }
      else if ((pbVar15[1] & 0xf) == 2) {
        uVar7 = (uint)*(short *)(pbVar15 + 2);
        pbVar14 = pbVar15 + 4;
      }
      else if ((pbVar15[1] & 0xf) == 1) {
        uVar7 = (uint)(char)pbVar15[2];
        pbVar14 = pbVar15 + 3;
      }
      else {
        uVar7 = *(uint *)(pbVar15 + 2);
        pbVar14 = pbVar15 + 6;
      }
      pbVar10->n = uVar7;
      iVar8 = uVar7 << (bcf_type_shift[bVar3 & 0xf] & 0x1f);
      pbVar10->size = iVar8;
      pbVar10->p = pbVar14;
      pbVar10->p_len = iVar8 * (uint)((ulong)uVar4 >> 0x28);
      *(uint *)&pbVar10->field_0x1c =
           (int)pbVar14 - (int)pbVar16 & 0x7fffffffU | *(uint *)&pbVar10->field_0x1c & 0x80000000;
    }
  }
  *(byte *)&line->unpacked = (byte)line->unpacked | 8;
  return 0;
}

Assistant:

int bcf_update_format(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, fmt_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,fmt_id) )
    {
        if ( !n ) return 0;
        return -1;  // the key not present in the header
    }

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==fmt_id ) break;
    bcf_fmt_t *fmt = i==line->n_fmt ? NULL : &line->d.fmt[i];

    if ( !n )
    {
        if ( fmt )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( fmt->p_free )
            {
                free(fmt->p - fmt->p_off);
                fmt->p_free = 0;
            }
            line->d.indiv_dirty = 1;
            fmt->p = NULL;
        }
        return 0;
    }

    line->n_sample = bcf_hdr_nsamples(hdr);
    int nps = n / line->n_sample;  // number of values per sample
    assert( nps && nps*line->n_sample==n );     // must be divisible by n_sample

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, fmt_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, nps);
    else if ( type==BCF_HT_REAL )
    {
        bcf_enc_size(&str, nps, BCF_BT_FLOAT);
        kputsn((char*)values, nps*line->n_sample*sizeof(float), &str);
    }
    else if ( type==BCF_HT_STR )
    {
        bcf_enc_size(&str, nps, BCF_BT_CHAR);
        kputsn((char*)values, nps*line->n_sample, &str);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    if ( !fmt )
    {
        // Not present, new format field
        line->n_fmt++;
        hts_expand0(bcf_fmt_t, line->n_fmt, line->d.m_fmt, line->d.fmt);

        // Special case: VCF specification requires that GT is always first
        if ( line->n_fmt > 1 && key[0]=='G' && key[1]=='T' && !key[2] )
        {
            for (i=line->n_fmt-1; i>0; i--)
                line->d.fmt[i] = line->d.fmt[i-1];
            fmt = &line->d.fmt[0];
        }
        else
            fmt = &line->d.fmt[line->n_fmt-1];
        bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
        line->d.indiv_dirty = 1;
        fmt->p_free = 1;
    }
    else
    {
        // The tag is already present, check if it is big enough to accomodate the new block
        if ( str.l <= fmt->p_len + fmt->p_off )
        {
            // good, the block is big enough
            if ( str.l != fmt->p_len + fmt->p_off ) line->d.indiv_dirty = 1;
            uint8_t *ptr = fmt->p - fmt->p_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int p_free = fmt->p_free;
            bcf_unpack_fmt_core1(ptr, line->n_sample, fmt);
            fmt->p_free = p_free;
        }
        else
        {
            assert( !fmt->p_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
            fmt->p_free = 1;
            line->d.indiv_dirty = 1;
        }
    }
    line->unpacked |= BCF_UN_FMT;
    return 0;
}